

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O1

void __thiscall
cfd::js::api::json::AddTaprootSchnorrSignTxInRequest::ConvertFromStruct
          (AddTaprootSchnorrSignTxInRequest *this,AddTaprootSchnorrSignTxInRequestStruct *data)

{
  std::__cxx11::string::_M_assign((string *)&this->txid_);
  this->vout_ = data->vout;
  std::__cxx11::string::_M_assign((string *)&this->signature_);
  std::__cxx11::string::_M_assign((string *)&this->sighash_type_);
  this->sighash_anyone_can_pay_ = data->sighash_anyone_can_pay;
  this->sighash_rangeproof_ = data->sighash_rangeproof;
  std::__cxx11::string::_M_assign((string *)&this->annex_);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->ignore_items)._M_t,&(data->ignore_items)._M_t);
  return;
}

Assistant:

void AddTaprootSchnorrSignTxInRequest::ConvertFromStruct(
    const AddTaprootSchnorrSignTxInRequestStruct& data) {
  txid_ = data.txid;
  vout_ = data.vout;
  signature_ = data.signature;
  sighash_type_ = data.sighash_type;
  sighash_anyone_can_pay_ = data.sighash_anyone_can_pay;
  sighash_rangeproof_ = data.sighash_rangeproof;
  annex_ = data.annex;
  ignore_items = data.ignore_items;
}